

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void parsespectype(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  int iVar2;
  long *file_00;
  char *pcVar3;
  void *pvVar4;
  rnndb *in_RDX;
  long in_RSI;
  long in_RDI;
  xmlNode *chain;
  int i;
  xmlAttr *attr;
  rnnspectype *res;
  rnntypeinfo *in_stack_ffffffffffffffc8;
  _xmlNode *p_Var5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  rnndb *db_00;
  
  file_00 = (long *)calloc(0x88,1);
  file_00[0x10] = in_RSI;
  for (p_Var5 = *(_xmlNode **)&in_RDX->groupsnum; p_Var5 != (_xmlNode *)0x0; p_Var5 = p_Var5->next)
  {
    iVar1 = strcmp((char *)p_Var5->name,"name");
    if (iVar1 == 0) {
      pcVar3 = getattrib(in_RDX,(char *)file_00,(int)((ulong)p_Var5 >> 0x20),
                         (xmlAttr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      pcVar3 = strdup(pcVar3);
      *file_00 = (long)pcVar3;
    }
    else {
      iVar1 = trytypeattr(in_RDX,(char *)file_00,p_Var5,
                          (xmlAttr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for spectype\n",in_RSI,
                (ulong)*(ushort *)&in_RDX->files,p_Var5->name);
        *(undefined4 *)(in_RDI + 0x80) = 1;
      }
    }
  }
  if (*file_00 == 0) {
    fprintf(_stderr,"%s:%d: nameless spectype\n",in_RSI,(ulong)*(ushort *)&in_RDX->files);
    *(undefined4 *)(in_RDI + 0x80) = 1;
  }
  else {
    db_00 = (rnndb *)0x0;
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x68); iVar1 = iVar1 + 1) {
      iVar2 = strcmp((char *)**(undefined8 **)(*(long *)(in_RDI + 0x60) + (long)iVar1 * 8),
                     (char *)*file_00);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s:%d: duplicated spectype name %s\n",in_RSI,
                (ulong)*(ushort *)&in_RDX->files,*file_00);
        *(undefined4 *)(in_RDI + 0x80) = 1;
        return;
      }
    }
    if (*(int *)(in_RDI + 0x6c) <= *(int *)(in_RDI + 0x68)) {
      if (*(int *)(in_RDI + 0x6c) == 0) {
        *(undefined4 *)(in_RDI + 0x6c) = 0x10;
      }
      else {
        *(int *)(in_RDI + 0x6c) = *(int *)(in_RDI + 0x6c) << 1;
      }
      pvVar4 = realloc(*(void **)(in_RDI + 0x60),(long)*(int *)(in_RDI + 0x6c) << 3);
      *(void **)(in_RDI + 0x60) = pvVar4;
    }
    iVar2 = *(int *)(in_RDI + 0x68);
    *(int *)(in_RDI + 0x68) = iVar2 + 1;
    *(long **)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 8) = file_00;
    for (p_Var5 = *(_xmlNode **)&(in_RDX->copyright).authorsnum; p_Var5 != (_xmlNode *)0x0;
        p_Var5 = p_Var5->next) {
      if ((((p_Var5->type == XML_ELEMENT_NODE) &&
           (iVar2 = trytypetag(in_RDX,(char *)file_00,(xmlNode *)db_00,
                               (rnntypeinfo *)CONCAT44(iVar1,in_stack_ffffffffffffffd0)), iVar2 == 0
           )) && (iVar2 = trytop(in_RDX,(char *)file_00,(xmlNode *)db_00), iVar2 == 0)) &&
         (iVar2 = trydoc(db_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),p_Var5), iVar2 == 0
         )) {
        fprintf(_stderr,"%s:%d: wrong tag in spectype: <%s>\n",in_RSI,(ulong)p_Var5->line,
                p_Var5->name);
        *(undefined4 *)(in_RDI + 0x80) = 1;
      }
    }
  }
  return;
}

Assistant:

static void parsespectype(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnspectype *res = calloc (sizeof *res, 1);
	res->file = file;
	xmlAttr *attr = node->properties;
	int i;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for spectype\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless spectype\n", file, node->line);
		db->estatus = 1;
		return;
	}
	for (i = 0; i < db->spectypesnum; i++)
		if (!strcmp(db->spectypes[i]->name, res->name)) {
			fprintf (stderr, "%s:%d: duplicated spectype name %s\n", file, node->line, res->name);
			db->estatus = 1;
			return;
		}
	ADDARRAY(db->spectypes, res);
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in spectype: <%s>\n", file, chain->line, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
}